

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::Qscale(ChQuaternion<double> *__return_storage_ptr__,ChQuaternion<double> *q,double fact)

{
  ChQuaternion<double> *result;
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  __return_storage_ptr__->m_data[0] = fact * q->m_data[0];
  __return_storage_ptr__->m_data[1] = fact * q->m_data[1];
  __return_storage_ptr__->m_data[2] = fact * q->m_data[2];
  __return_storage_ptr__->m_data[3] = fact * q->m_data[3];
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Qscale(const ChQuaternion<double>& q, double fact) {
    ChQuaternion<double> result;
    result.e0() = q.e0() * fact;
    result.e1() = q.e1() * fact;
    result.e2() = q.e2() * fact;
    result.e3() = q.e3() * fact;
    return result;
}